

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsplitter.cpp
# Opt level: O3

void QSplitter::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Orientation *pOVar1;
  byte *pbVar2;
  QSplitterPrivate *this;
  long lVar3;
  Orientation OVar4;
  bool bVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined4 local_50;
  undefined4 local_4c;
  void *local_48;
  undefined4 *local_40;
  undefined4 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (_id == 0 && _c == InvokeMetaMethod) {
    local_4c = *_a[1];
    local_50 = *_a[2];
    local_40 = &local_4c;
    local_38 = &local_50;
    local_48 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_48);
  }
  if (_c != ReadProperty) {
    if (_c == WriteProperty) {
      if ((uint)_id < 4) {
        pOVar1 = (Orientation *)*_a;
        switch(_id) {
        case 0:
          setOrientation((QSplitter *)_o,*pOVar1);
          break;
        case 1:
          OVar4 = *pOVar1;
          lVar3 = *(long *)(_o + 8);
          *(undefined1 *)(lVar3 + 0x2ad) = 1;
          *(char *)(lVar3 + 0x2a4) = (char)OVar4;
          break;
        case 2:
          this = *(QSplitterPrivate **)(_o + 8);
          this->handleWidth = *pOVar1;
          QSplitterPrivate::recalc
                    (this,SUB21((ushort)*(undefined2 *)
                                         (*(long *)(*(long *)&(this->super_QFramePrivate).
                                                              super_QWidgetPrivate.field_0x8 + 0x20)
                                         + 8) >> 0xf,0));
          break;
        case 3:
          *(char *)(*(long *)(_o + 8) + 0x2a6) = (char)*pOVar1;
        }
      }
    }
    else if (((_c == IndexOfMethod) && (*_a[1] == splitterMoved)) &&
            (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    goto LAB_00485615;
  }
  if (3 < (uint)_id) goto LAB_00485615;
  pbVar2 = (byte *)*_a;
  switch(_id) {
  case 0:
    iVar6 = *(int *)(*(long *)(_o + 8) + 0x2a0);
    break;
  case 1:
    bVar5 = opaqueResize((QSplitter *)_o);
    goto LAB_00485612;
  case 2:
    iVar6 = handleWidth((QSplitter *)_o);
    break;
  case 3:
    bVar5 = (bool)(*(byte *)(*(long *)(_o + 8) + 0x2a6) & 1);
LAB_00485612:
    *pbVar2 = bVar5;
    goto LAB_00485615;
  }
  *(int *)pbVar2 = iVar6;
LAB_00485615:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitter::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSplitter *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->splitterMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSplitter::*)(int , int )>(_a, &QSplitter::splitterMoved, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Qt::Orientation*>(_v) = _t->orientation(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->opaqueResize(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->handleWidth(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->childrenCollapsible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrientation(*reinterpret_cast<Qt::Orientation*>(_v)); break;
        case 1: _t->setOpaqueResize(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setHandleWidth(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setChildrenCollapsible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}